

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void testing::Mock::UnregisterLocked(UntypedFunctionMockerBase *mocker)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>,_std::_Select1st<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  *this;
  _Link_type __p;
  pair<std::_Rb_tree_iterator<testing::internal::UntypedFunctionMockerBase_*>,_std::_Rb_tree_iterator<testing::internal::UntypedFunctionMockerBase_*>_>
  pVar3;
  key_type local_30;
  
  internal::MutexBase::AssertHeld((MutexBase *)internal::g_gmock_mutex);
  if ((anonymous_namespace)::g_mock_object_registry._24_8_ != 0x193770) {
    p_Var2 = (_Rb_tree_node_base *)(anonymous_namespace)::g_mock_object_registry._24_8_;
    do {
      pVar3 = std::
              _Rb_tree<testing::internal::UntypedFunctionMockerBase_*,_testing::internal::UntypedFunctionMockerBase_*,_std::_Identity<testing::internal::UntypedFunctionMockerBase_*>,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
              ::equal_range((_Rb_tree<testing::internal::UntypedFunctionMockerBase_*,_testing::internal::UntypedFunctionMockerBase_*,_std::_Identity<testing::internal::UntypedFunctionMockerBase_*>,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
                             *)(p_Var2 + 4),&local_30);
      p_Var1 = p_Var2[5]._M_parent;
      std::
      _Rb_tree<testing::internal::UntypedFunctionMockerBase_*,_testing::internal::UntypedFunctionMockerBase_*,_std::_Identity<testing::internal::UntypedFunctionMockerBase_*>,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
      ::_M_erase_aux((_Rb_tree<testing::internal::UntypedFunctionMockerBase_*,_testing::internal::UntypedFunctionMockerBase_*,_std::_Identity<testing::internal::UntypedFunctionMockerBase_*>,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
                      *)(p_Var2 + 4),(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node)
      ;
      if (p_Var1 != p_Var2[5]._M_parent) {
        if (p_Var2[5]._M_parent != (_Base_ptr)0x0) {
          return;
        }
        __p = (_Link_type)((anonymous_namespace)::g_mock_object_registry + 8);
        this = (_Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>,_std::_Select1st<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                *)std::_Rb_tree_rebalance_for_erase
                            (p_Var2,(_Rb_tree_node_base *)
                                    ((anonymous_namespace)::g_mock_object_registry + 8));
        std::
        _Rb_tree<const_void_*,_std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>,_std::_Select1st<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
        ::_M_drop_node(this,__p);
        (anonymous_namespace)::g_mock_object_registry._40_8_ =
             (anonymous_namespace)::g_mock_object_registry._40_8_ + -1;
        return;
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)((anonymous_namespace)::g_mock_object_registry + 8));
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(internal::g_gmock_mutex) {
  internal::g_gmock_mutex.AssertHeld();
  for (MockObjectRegistry::StateMap::iterator it =
           g_mock_object_registry.states().begin();
       it != g_mock_object_registry.states().end(); ++it) {
    FunctionMockers& mockers = it->second.function_mockers;
    if (mockers.erase(mocker) > 0) {
      // mocker was in mockers and has been just removed.
      if (mockers.empty()) {
        g_mock_object_registry.states().erase(it);
      }
      return;
    }
  }
}